

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

string * __thiscall wallet::COutput::ToString_abi_cxx11_(COutput *this)

{
  long lVar1;
  uint *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  string *args;
  char *in_stack_ffffffffffffffb8;
  CAmount in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args = in_RDI;
  transaction_identifier<false>::ToString_abi_cxx11_((transaction_identifier<false> *)in_RDI);
  FormatMoney_abi_cxx11_(in_stack_ffffffffffffffc0);
  tinyformat::format<std::__cxx11::string,unsigned_int,int,std::__cxx11::string>
            (in_stack_ffffffffffffffb8,args,in_RSI,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string COutput::ToString() const
{
    return strprintf("COutput(%s, %d, %d) [%s]", outpoint.hash.ToString(), outpoint.n, depth, FormatMoney(txout.nValue));
}